

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_capability(connectdata *conn)

{
  CURLcode CVar1;
  imap_conn *imapc;
  CURLcode result;
  connectdata *conn_local;
  
  (conn->proto).ftpc.diralloc = 0;
  *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
  (conn->proto).imapc.tls_supported = false;
  CVar1 = imap_sendf(conn,"CAPABILITY");
  if (CVar1 == CURLE_OK) {
    state(conn,IMAP_CAPABILITY);
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_capability(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  imapc->sasl.authmechs = SASL_AUTH_NONE; /* No known auth. mechanisms yet */
  imapc->sasl.authused = SASL_AUTH_NONE;  /* Clear the auth. mechanism used */
  imapc->tls_supported = FALSE;           /* Clear the TLS capability */

  /* Send the CAPABILITY command */
  result = imap_sendf(conn, "CAPABILITY");

  if(!result)
    state(conn, IMAP_CAPABILITY);

  return result;
}